

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

int set_wall(level *lev,int x,int y,int horiz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (horiz == 0) {
    iVar1 = check_pos(lev,x + -1,y,1);
    x = x + 1;
  }
  else {
    iVar1 = check_pos(lev,x,y + -1,1);
    y = y + 1;
  }
  iVar2 = check_pos(lev,x,y,2);
  iVar3 = 0;
  if (iVar2 == 0) {
    iVar3 = iVar2 + iVar1;
  }
  if (iVar1 == 0) {
    iVar3 = iVar2 + iVar1;
  }
  return iVar3;
}

Assistant:

static int set_wall(struct level *lev, int x, int y, int horiz)
{
    int wmode, is_1, is_2;

    if (horiz) {
	is_1 = check_pos(lev, x,y-1, WM_W_TOP);
	is_2 = check_pos(lev, x,y+1, WM_W_BOTTOM);
    } else {
	is_1 = check_pos(lev, x-1,y, WM_W_LEFT);
	is_2 = check_pos(lev, x+1,y, WM_W_RIGHT);
    }
    if (more_than_one(is_1, is_2, 0)) {
	wmode = 0;
    } else {
	wmode = is_1 + is_2;
    }
    return wmode;
}